

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O2

void __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::LogFreeSegment(PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                 *this,SegmentBase<Memory::VirtualAllocWrapper> *segment)

{
  size_t sVar1;
  PageMemoryData *pPVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  sVar1 = segment->segmentPageCount;
  auVar4._8_4_ = (int)sVar1;
  auVar4._0_8_ = sVar1;
  auVar4._12_4_ = (int)(sVar1 >> 0x20);
  auVar3._0_8_ = sVar1 * 0x1000;
  auVar3._8_8_ = auVar4._8_8_ * 0x1000;
  this->reservedBytes = this->reservedBytes + sVar1 * -0x1000;
  this->committedBytes = this->committedBytes + auVar4._8_8_ * -0x1000;
  this->numberOfSegments = this->numberOfSegments - 1;
  pPVar2 = this->memoryData;
  if (pPVar2 != (PageMemoryData *)0x0) {
    auVar4 = pmovsxbq(auVar3,0x101);
    pPVar2->releaseSegmentCount = auVar4._0_8_ + pPVar2->releaseSegmentCount;
    pPVar2->releaseSegmentBytes = sVar1 * 0x1000 + pPVar2->releaseSegmentBytes;
    pPVar2->currentCommittedPageCount = pPVar2->currentCommittedPageCount - sVar1;
  }
  return;
}

Assistant:

size_t GetPageCount() const { return segmentPageCount; }